

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

bool __thiscall
QDockWidgetGroupWindow::hover(QDockWidgetGroupWindow *this,QLayoutItem *widgetItem,QPoint *mousePos)

{
  _func_int **pp_Var1;
  Alignment AVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data *pDVar6;
  QDockAreaLayoutItem *pQVar7;
  qsizetype qVar8;
  bool bVar9;
  DockOptions DVar10;
  QLayout *pQVar11;
  QLayout *pQVar12;
  QDockWidgetGroupWindow *this_00;
  QDockAreaLayoutInfo *pQVar13;
  iterator iVar14;
  long lVar15;
  int iVar16;
  TabMode tabMode;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_f8;
  undefined1 local_d8 [40];
  undefined1 auStack_b0 [16];
  QMainWindow *pQStack_a0;
  QArrayDataPointer<QDockAreaLayoutItem> local_98;
  ulong uStack_80;
  QTabBar *local_78;
  Int IStack_70;
  undefined4 uStack_6c;
  QDockAreaLayoutItem local_68;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = QWidget::layout((QWidget *)this);
  bVar9 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)(pQVar11 + 8));
  if (bVar9) {
    pQVar12 = QWidget::layout((QWidget *)this);
    *(_func_int ***)(pQVar11 + 8) = pQVar12[4].super_QLayoutItem._vptr_QLayoutItem;
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)&pQVar11[8].field_0x8,
               (QArrayDataPointer<QWidget_*> *)&pQVar12[4].super_QLayoutItem.align);
    AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         pQVar12[5].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
    uVar3 = *(undefined4 *)&pQVar12[5].super_QLayoutItem.field_0xc;
    pp_Var1 = *(_func_int ***)(pQVar12 + 6);
    uVar4 = *(undefined4 *)&pQVar12[6].field_0x8;
    uVar5 = *(undefined4 *)&pQVar12[6].field_0xc;
    *(_func_int ***)(pQVar11 + 9) = pQVar12[5].super_QLayoutItem._vptr_QLayoutItem;
    *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&pQVar11[9].field_0x8 =
         AVar2.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
    *(undefined4 *)&pQVar11[9].field_0xc = uVar3;
    pQVar11[9].super_QLayoutItem._vptr_QLayoutItem = pp_Var1;
    pQVar11[9].super_QLayoutItem.align = (Alignment)uVar4;
    *(undefined4 *)&pQVar11[9].super_QLayoutItem.field_0xc = uVar5;
    QArrayDataPointer<QDockAreaLayoutItem>::operator=
              ((QArrayDataPointer<QDockAreaLayoutItem> *)(pQVar11 + 10),
               (QArrayDataPointer<QDockAreaLayoutItem> *)&pQVar12[6].super_QLayoutItem);
    uVar3 = *(undefined4 *)&pQVar12[7].field_0xc;
    pp_Var1 = pQVar12[7].super_QLayoutItem._vptr_QLayoutItem;
    pQVar11[10].super_QLayoutItem.align = (Alignment)*(undefined4 *)&pQVar12[7].field_0x8;
    *(undefined4 *)&pQVar11[10].super_QLayoutItem.field_0xc = uVar3;
    *(_func_int ***)(pQVar11 + 0xb) = pp_Var1;
    *(Int *)&pQVar11[0xb].field_0x8 =
         pQVar12[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
         super_QFlagsStorage<Qt::AlignmentFlag>.i;
  }
  DVar10 = QMainWindow::dockOptions(*(QMainWindow **)(*(long *)(this + 8) + 0x10));
  local_d8._0_8_ = *(undefined8 *)(pQVar11 + 8);
  local_d8._8_8_ = *(undefined8 *)&pQVar11[8].field_0x8;
  local_d8._16_8_ = pQVar11[8].super_QLayoutItem._vptr_QLayoutItem;
  local_d8._24_8_ = *(undefined8 *)&pQVar11[8].super_QLayoutItem.align;
  if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_d8._8_8_)->ref_)->ref_)._q_value.super___atomic_base<int>.
    _M_i = (((QArrayData *)&((QArrayData *)local_d8._8_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8._32_8_ = *(undefined8 *)(pQVar11 + 9);
  auStack_b0._0_4_ = *(undefined4 *)&pQVar11[9].field_0x8;
  auStack_b0._4_4_ = *(undefined4 *)&pQVar11[9].field_0xc;
  auStack_b0._8_8_ = pQVar11[9].super_QLayoutItem._vptr_QLayoutItem;
  pQStack_a0 = *(QMainWindow **)&pQVar11[9].super_QLayoutItem.align;
  local_98.d = *(Data **)(pQVar11 + 10);
  local_98.ptr = *(QDockAreaLayoutItem **)&pQVar11[10].field_0x8;
  local_98.size = (qsizetype)pQVar11[10].super_QLayoutItem._vptr_QLayoutItem;
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  uStack_6c = 0xaaaaaaaa;
  IStack_70 = *(int *)&pQVar11[0xb].field_0x8;
  uStack_80 = *(ulong *)&pQVar11[10].super_QLayoutItem.align;
  local_78 = *(QTabBar **)(pQVar11 + 0xb);
  tabMode = ForceTabs -
            (((uint)DVar10.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 8) == 0);
  if (((uint)DVar10.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
             super_QFlagsStorage<QMainWindow::DockOption>.i & 2) == 0) {
    tabMode = ForceTabs;
  }
  (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  this_00 = (QDockWidgetGroupWindow *)QMetaObject::cast((QObject *)&staticMetaObject);
  if ((this_00 != (QDockWidgetGroupWindow *)0x0) &&
     (pQVar13 = tabLayoutInfo(this_00), pQVar13 == (QDockAreaLayoutInfo *)0x0)) {
    tabMode = NoTabs;
  }
  if (uStack_80._0_1_ == true) {
    pQVar13 = (QDockAreaLayoutInfo *)operator_new(0x70);
    pQVar13->sep = (int *)local_d8._0_8_;
    (pQVar13->separatorWidgets).d.d = (Data *)local_d8._8_8_;
    (pQVar13->separatorWidgets).d.ptr = (QWidget **)local_d8._16_8_;
    (pQVar13->separatorWidgets).d.size = local_d8._24_8_;
    if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_d8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_d8._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (pQVar13->rect).x2 = (Representation)auStack_b0._8_4_;
    (pQVar13->rect).y2 = (Representation)auStack_b0._12_4_;
    pQVar13->mainWindow = pQStack_a0;
    pQVar13->dockPos = local_d8._32_4_;
    pQVar13->o = local_d8._36_4_;
    (pQVar13->rect).x1 = (Representation)auStack_b0._0_4_;
    (pQVar13->rect).y1 = (Representation)auStack_b0._4_4_;
    (pQVar13->item_list).d.d = local_98.d;
    (pQVar13->item_list).d.ptr = local_98.ptr;
    (pQVar13->item_list).d.size = local_98.size;
    if (local_98.d != (Data *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar13->tabBarShape = IStack_70;
    *(ulong *)&pQVar13->tabbed = uStack_80;
    pQVar13->tabBar = local_78;
    QDockAreaLayoutItem::QDockAreaLayoutItem(&local_68,pQVar13);
    QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
              ((QArrayDataPointer<QDockAreaLayoutItem> *)(local_d8 + 0x40),&local_68,local_40);
    QDockAreaLayoutItem::~QDockAreaLayoutItem(&local_68);
    iVar16 = *(int *)((long)&pQVar11[9].super_QLayoutItem._vptr_QLayoutItem + 4) -
             *(int *)&pQVar11[9].field_0xc;
    if (*(int *)&pQVar11[9].field_0x4 == 1) {
      iVar16 = *(int *)&pQVar11[9].super_QLayoutItem._vptr_QLayoutItem -
               *(int *)&pQVar11[9].field_0x8;
    }
    iVar14 = QList<QDockAreaLayoutItem>::begin((QList<QDockAreaLayoutItem> *)(local_d8 + 0x40));
    (iVar14.i)->size = iVar16 + 1;
    uStack_80 = uStack_80 & 0xffffffffffffff00;
    local_78 = (QTabBar *)0x0;
  }
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  QDockAreaLayoutInfo::gapIndex
            ((QList<int> *)&local_f8,(QDockAreaLayoutInfo *)local_d8,mousePos,
             ((uint)DVar10.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                    super_QFlagsStorage<QMainWindow::DockOption>.i & 10) == 2,tabMode);
  if ((undefined1 *)local_f8.size == *(undefined1 **)(this + 0x48)) {
    if ((local_f8.ptr != *(int **)(this + 0x40)) &&
       ((undefined1 *)local_f8.size != (undefined1 *)0x0)) {
      lVar15 = 0;
      do {
        if (*(int *)((long)local_f8.ptr + lVar15) != *(int *)((long)*(int **)(this + 0x40) + lVar15)
           ) goto LAB_0042e2fb;
        lVar15 = lVar15 + 4;
      } while (local_f8.size << 2 != lVar15);
    }
  }
  else {
LAB_0042e2fb:
    bVar9 = QDockAreaLayoutInfo::hasGapItem((QDockAreaLayoutInfo *)local_d8,(QList<int> *)&local_f8)
    ;
    if (!bVar9) {
      QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)(this + 0x38),&local_f8);
      QDockAreaLayoutInfo::insertGap
                ((QDockAreaLayoutInfo *)local_d8,(QList<int> *)(this + 0x38),widgetItem);
      QDockAreaLayoutInfo::fitItems((QDockAreaLayoutInfo *)local_d8);
      pQVar11 = QWidget::layout((QWidget *)this);
      pQVar11[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_d8._0_8_;
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)&pQVar11[4].super_QLayoutItem.align,
                 (QArrayDataPointer<QWidget_*> *)(local_d8 + 8));
      qVar8 = local_98.size;
      pQVar7 = local_98.ptr;
      pDVar6 = local_98.d;
      *(undefined8 *)(pQVar11 + 6) = auStack_b0._8_8_;
      *(QMainWindow **)&pQVar11[6].field_0x8 = pQStack_a0;
      pQVar11[5].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_d8._32_8_;
      *(undefined8 *)&pQVar11[5].super_QLayoutItem.align = auStack_b0._0_8_;
      local_98.size = 0;
      local_98.d = (Data *)0x0;
      local_98.ptr = (QDockAreaLayoutItem *)0x0;
      local_68.widgetItem = (QLayoutItem *)pQVar11[6].super_QLayoutItem._vptr_QLayoutItem;
      local_68.subinfo = *(QDockAreaLayoutInfo **)&pQVar11[6].super_QLayoutItem.align;
      pQVar11[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar6;
      *(QDockAreaLayoutItem **)&pQVar11[6].super_QLayoutItem.align = pQVar7;
      local_68.placeHolderItem = *(QPlaceHolderItem **)(pQVar11 + 7);
      *(qsizetype *)(pQVar11 + 7) = qVar8;
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer
                ((QArrayDataPointer<QDockAreaLayoutItem> *)&local_68);
      pQVar11[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = IStack_70;
      *(ulong *)&pQVar11[7].field_0x8 = uStack_80;
      pQVar11[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_78;
      updateCurrentGapRect(this);
      pQVar11 = QWidget::layout((QWidget *)this);
      QDockAreaLayoutInfo::apply
                ((QDockAreaLayoutInfo *)&pQVar11[4].super_QLayoutItem,
                 (bool)((byte)DVar10.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                              super_QFlagsStorage<QMainWindow::DockOption>.i & 1));
      bVar9 = true;
      goto LAB_0042e414;
    }
  }
  bVar9 = false;
LAB_0042e414:
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,4,0x10);
    }
  }
  QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer
            ((QArrayDataPointer<QDockAreaLayoutItem> *)(local_d8 + 0x40));
  if ((QArrayData *)local_d8._8_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_d8._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_d8._8_8_,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QDockWidgetGroupWindow::hover(QLayoutItem *widgetItem, const QPoint &mousePos)
{
    QDockAreaLayoutInfo &savedState = static_cast<QDockWidgetGroupLayout *>(layout())->savedState;
    if (savedState.isEmpty())
        savedState = *layoutInfo();

    QMainWindow::DockOptions opts = static_cast<QMainWindow *>(parentWidget())->dockOptions();
    QDockAreaLayoutInfo newState = savedState;
    bool nestingEnabled =
        (opts & QMainWindow::AllowNestedDocks) && !(opts & QMainWindow::ForceTabbedDocks);
    QDockAreaLayoutInfo::TabMode tabMode =
#if !QT_CONFIG(tabbar)
        QDockAreaLayoutInfo::NoTabs;
#else
        nestingEnabled ? QDockAreaLayoutInfo::AllowTabs : QDockAreaLayoutInfo::ForceTabs;
    if (auto group = qobject_cast<QDockWidgetGroupWindow *>(widgetItem->widget())) {
        if (!group->tabLayoutInfo())
            tabMode = QDockAreaLayoutInfo::NoTabs;
    }
    if (newState.tabbed) {
        // insertion into a top-level tab
        newState.item_list = { QDockAreaLayoutItem(new QDockAreaLayoutInfo(newState)) };
        newState.item_list.first().size = pick(savedState.o, savedState.rect.size());
        newState.tabbed = false;
        newState.tabBar = nullptr;
    }
#endif

    auto newGapPos = newState.gapIndex(mousePos, nestingEnabled, tabMode);
    Q_ASSERT(!newGapPos.isEmpty());

    // Do not insert a new gap item, if the current position already is a gap,
    // or if the group window contains one
    if (newGapPos == currentGapPos || newState.hasGapItem(newGapPos))
        return false;

    currentGapPos = newGapPos;
    newState.insertGap(currentGapPos, widgetItem);
    newState.fitItems();
    *layoutInfo() = std::move(newState);
    updateCurrentGapRect();
    layoutInfo()->apply(opts & QMainWindow::AnimatedDocks);
    return true;
}